

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O3

void __thiscall
GuidedMeshNormalFiltering::updateFilteredNormals
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  ParameterSet *this_00;
  bool bVar1;
  string local_60;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *local_40;
  int local_34 [2];
  int denoise_index;
  
  this_00 = (this->super_MeshDenoisingBase).parameter_set_;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40 = filtered_normals;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Denoise Type","");
  bVar1 = ParameterSet::getValue(this_00,&local_60,local_34);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (bVar1) {
    if (local_34[0] == 0) {
      updateFilteredNormalsLocalScheme(this,mesh,local_40);
    }
    else {
      updateFilteredNormalsGlobalScheme(this,mesh,local_40);
    }
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::updateFilteredNormals(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    // get parameter for normal update
    int denoise_index;
    if(!parameter_set_->getValue(string("Denoise Type"), denoise_index))
        return;

    DenoiseType denoise_type = (denoise_index == 0) ? kLocal : kGlobal;

    if(denoise_type == kLocal)
        updateFilteredNormalsLocalScheme(mesh, filtered_normals);
    else if(denoise_type == kGlobal)
        updateFilteredNormalsGlobalScheme(mesh, filtered_normals);

}